

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  int iVar1;
  secp256k1_fe i;
  secp256k1_fe z12;
  secp256k1_fe az;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe h;
  secp256k1_fe u2;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe s2;
  
  secp256k1_gej_verify(a);
  secp256k1_ge_verify(b);
  secp256k1_fe_verify(bzinv);
  if (a->infinity == 0) {
    if (b->infinity != 0) {
      memcpy(r,a,0x98);
      return;
    }
    secp256k1_fe_mul(&az,&a->z,bzinv);
    secp256k1_fe_sqr(&z12,&az);
    u1.n[0] = (a->x).n[0];
    u1.n[1] = (a->x).n[1];
    u1.n[2] = (a->x).n[2];
    u1.n[3] = (a->x).n[3];
    u1.n[4] = (a->x).n[4];
    u1.magnitude = (a->x).magnitude;
    u1.normalized = (a->x).normalized;
    secp256k1_fe_mul(&u2,&b->x,&z12);
    s1.n[0] = (a->y).n[0];
    s1.n[1] = (a->y).n[1];
    s1.n[2] = (a->y).n[2];
    s1.n[3] = (a->y).n[3];
    s1.n[4] = (a->y).n[4];
    s1.magnitude = (a->y).magnitude;
    s1.normalized = (a->y).normalized;
    secp256k1_fe_mul(&s2,&b->y,&z12);
    secp256k1_fe_mul(&s2,&s2,&az);
    secp256k1_fe_negate_unchecked(&h,&u1,4);
    secp256k1_fe_add(&h,&u2);
    secp256k1_fe_negate_unchecked(&i,&s2,1);
    secp256k1_fe_add(&i,&s1);
    iVar1 = secp256k1_fe_normalizes_to_zero_var(&h);
    if (iVar1 != 0) {
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&i);
      if (iVar1 != 0) {
        secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
        return;
      }
      secp256k1_gej_set_infinity(r);
      return;
    }
    r->infinity = 0;
    secp256k1_fe_mul(&r->z,&a->z,&h);
    secp256k1_fe_sqr(&h2,&h);
    secp256k1_fe_negate_unchecked(&h2,&h2,1);
    secp256k1_fe_mul(&h3,&h2,&h);
    secp256k1_fe_mul(&t,&u1,&h2);
    secp256k1_fe_sqr(&r->x,&i);
    secp256k1_fe_add(&r->x,&h3);
    secp256k1_fe_add(&r->x,&t);
    secp256k1_fe_add(&r->x,&t);
    secp256k1_fe_add(&t,&r->x);
    secp256k1_fe_mul(&r->y,&t,&i);
    secp256k1_fe_mul(&h3,&h3,&s1);
    secp256k1_fe_add(&r->y,&h3);
  }
  else {
    r->infinity = b->infinity;
    secp256k1_fe_sqr(&az,bzinv);
    secp256k1_fe_mul(&z12,&az,bzinv);
    secp256k1_fe_mul(&r->x,&b->x,&az);
    secp256k1_fe_mul(&r->y,&b->y,&z12);
    secp256k1_fe_set_int(&r->z,1);
  }
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* Operations: 9 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    SECP256K1_FE_VERIFY(bzinv);

    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        SECP256K1_GEJ_VERIFY(r);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}